

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_storage_class.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::FixStorageClass::PropagateType
          (FixStorageClass *this,Instruction *inst,uint32_t type_id,uint32_t op_idx,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *seen)

{
  initializer_list<unsigned_int> init_list;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *psVar1;
  Instruction *pIVar2;
  bool bVar3;
  Op OVar4;
  int iVar5;
  IRContext *pIVar6;
  TypeManager *pTVar7;
  Type *pTVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DefUseManager *pDVar9;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar10;
  uint32_t local_134;
  reference local_130;
  pair<spvtools::opt::Instruction_*,_unsigned_int> *use;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  *__range3;
  function<void_(spvtools::opt::Instruction_*,_unsigned_int)> local_108;
  undefined1 local_e8 [8];
  vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  uses;
  SmallVector<unsigned_int,_2UL> local_b8;
  uint32_t local_90;
  uint32_t local_8c;
  uint32_t copy_id;
  uint32_t pointee_type_id;
  Instruction *ptr_inst;
  uint32_t ptr_id;
  uint32_t obj_type_id;
  Instruction *obj_inst;
  Instruction *pIStack_68;
  uint32_t obj_id;
  Instruction *type_inst;
  undefined1 local_58;
  uint32_t local_4c;
  _Base_ptr local_48;
  undefined1 local_40;
  uint32_t local_38;
  byte local_31;
  uint32_t new_type_id;
  bool modified;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *seen_local;
  uint32_t op_idx_local;
  uint32_t type_id_local;
  Instruction *inst_local;
  FixStorageClass *this_local;
  
  _new_type_id = seen;
  seen_local._0_4_ = op_idx;
  seen_local._4_4_ = type_id;
  _op_idx_local = inst;
  inst_local = (Instruction *)this;
  if (type_id == 0) {
    __assert_fail("type_id != 0 && \"Not given a valid type in PropagateType\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fix_storage_class.cpp"
                  ,0xb7,
                  "bool spvtools::opt::FixStorageClass::PropagateType(Instruction *, uint32_t, uint32_t, std::set<uint32_t> *)"
                 );
  }
  local_31 = 0;
  local_38 = 0;
  OVar4 = opt::Instruction::opcode(inst);
  psVar1 = _new_type_id;
  if (OVar4 == OpFunctionCall) {
    return false;
  }
  if (OVar4 == OpImageTexelPointer) {
LAB_009bf765:
    this_local._7_1_ = false;
  }
  else {
    if (OVar4 == OpLoad) {
      pDVar9 = Pass::get_def_use_mgr(&this->super_Pass);
      pIStack_68 = analysis::DefUseManager::GetDef(pDVar9,seen_local._4_4_);
      local_38 = opt::Instruction::GetSingleWordInOperand(pIStack_68,1);
    }
    else if (OVar4 == OpStore) {
      obj_inst._4_4_ = opt::Instruction::GetSingleWordInOperand(_op_idx_local,1);
      pDVar9 = Pass::get_def_use_mgr(&this->super_Pass);
      _ptr_id = analysis::DefUseManager::GetDef(pDVar9,obj_inst._4_4_);
      ptr_inst._4_4_ = opt::Instruction::type_id(_ptr_id);
      ptr_inst._0_4_ = opt::Instruction::GetSingleWordInOperand(_op_idx_local,0);
      pDVar9 = Pass::get_def_use_mgr(&this->super_Pass);
      _copy_id = analysis::DefUseManager::GetDef(pDVar9,(uint32_t)ptr_inst);
      local_8c = Pass::GetPointeeTypeId(&this->super_Pass,_copy_id);
      if (ptr_inst._4_4_ != local_8c) {
        pIVar6 = Pass::context(&this->super_Pass);
        pTVar7 = IRContext::get_type_mgr(pIVar6);
        pTVar8 = analysis::TypeManager::GetType(pTVar7,ptr_inst._4_4_);
        iVar5 = (*pTVar8->_vptr_Type[0x11])();
        if (CONCAT44(extraout_var,iVar5) != 0) {
          pIVar6 = Pass::context(&this->super_Pass);
          pTVar7 = IRContext::get_type_mgr(pIVar6);
          pTVar8 = analysis::TypeManager::GetType(pTVar7,local_8c);
          iVar5 = (*pTVar8->_vptr_Type[0x11])();
          if (CONCAT44(extraout_var_00,iVar5) != 0) {
            return false;
          }
        }
        uses.
        super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             Pass::GenerateCopy(&this->super_Pass,_ptr_id,local_8c,_op_idx_local);
        pIVar2 = _op_idx_local;
        if (uses.
            super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
          return false;
        }
        init_list._M_len = 1;
        init_list._M_array =
             (iterator)
             ((long)&uses.
                     super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
        local_90 = uses.
                   super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_b8,init_list);
        opt::Instruction::SetInOperand(pIVar2,1,&local_b8);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_b8);
        pIVar6 = Pass::context(&this->super_Pass);
        IRContext::UpdateDefUse(pIVar6,_op_idx_local);
      }
    }
    else if (1 < OVar4 - OpCopyMemory) {
      if ((OVar4 - OpAccessChain < 3) || (OVar4 == OpInBoundsPtrAccessChain)) {
        if ((uint32_t)seen_local == 2) {
          local_38 = WalkAccessChainType(this,_op_idx_local,seen_local._4_4_);
        }
      }
      else if (2 < OVar4 - OpCompositeConstruct) {
        if (OVar4 == OpCopyObject) {
          local_38 = seen_local._4_4_;
        }
        else {
          if (OVar4 == OpBitcast) goto LAB_009bf765;
          if (OVar4 == OpSelect) {
            if (2 < (uint32_t)seen_local) {
              local_38 = seen_local._4_4_;
            }
          }
          else if (OVar4 == OpPhi) {
            local_4c = opt::Instruction::result_id(_op_idx_local);
            pVar10 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::insert(psVar1,&local_4c);
            type_inst = (Instruction *)pVar10.first._M_node;
            local_58 = pVar10.second;
            local_48 = (_Base_ptr)type_inst;
            local_40 = local_58;
            if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              local_38 = seen_local._4_4_;
            }
          }
        }
      }
    }
    if (local_38 != 0) {
      local_31 = ChangeResultType(this,_op_idx_local,local_38);
      std::
      vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
      ::vector((vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                *)local_e8);
      pDVar9 = Pass::get_def_use_mgr(&this->super_Pass);
      pIVar2 = _op_idx_local;
      __range3 = (vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                  *)local_e8;
      std::function<void(spvtools::opt::Instruction*,unsigned_int)>::
      function<spvtools::opt::FixStorageClass::PropagateType(spvtools::opt::Instruction*,unsigned_int,unsigned_int,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>*)::__0,void>
                ((function<void(spvtools::opt::Instruction*,unsigned_int)> *)&local_108,
                 (anon_class_8_1_899298ca *)&__range3);
      analysis::DefUseManager::ForEachUse(pDVar9,pIVar2,&local_108);
      std::function<void_(spvtools::opt::Instruction_*,_unsigned_int)>::~function(&local_108);
      __end3 = std::
               vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
               ::begin((vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                        *)local_e8);
      use = (pair<spvtools::opt::Instruction_*,_unsigned_int> *)
            std::
            vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
            ::end((vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                   *)local_e8);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>_>
                                         *)&use), bVar3) {
        local_130 = __gnu_cxx::
                    __normal_iterator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>_>
                    ::operator*(&__end3);
        PropagateType(this,local_130->first,local_38,local_130->second,_new_type_id);
        __gnu_cxx::
        __normal_iterator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>_>
        ::operator++(&__end3);
      }
      OVar4 = opt::Instruction::opcode(_op_idx_local);
      psVar1 = _new_type_id;
      if (OVar4 == OpPhi) {
        local_134 = opt::Instruction::result_id(_op_idx_local);
        std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::erase
                  (psVar1,&local_134);
      }
      std::
      vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
      ::~vector((vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                 *)local_e8);
    }
    this_local._7_1_ = (bool)(local_31 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool FixStorageClass::PropagateType(Instruction* inst, uint32_t type_id,
                                    uint32_t op_idx, std::set<uint32_t>* seen) {
  assert(type_id != 0 && "Not given a valid type in PropagateType");
  bool modified = false;

  // If the type of operand |op_idx| forces the result type of |inst| to a
  // particular type, then we want find that type.
  uint32_t new_type_id = 0;
  switch (inst->opcode()) {
    case spv::Op::OpAccessChain:
    case spv::Op::OpPtrAccessChain:
    case spv::Op::OpInBoundsAccessChain:
    case spv::Op::OpInBoundsPtrAccessChain:
      if (op_idx == 2) {
        new_type_id = WalkAccessChainType(inst, type_id);
      }
      break;
    case spv::Op::OpCopyObject:
      new_type_id = type_id;
      break;
    case spv::Op::OpPhi:
      if (seen->insert(inst->result_id()).second) {
        new_type_id = type_id;
      }
      break;
    case spv::Op::OpSelect:
      if (op_idx > 2) {
        new_type_id = type_id;
      }
      break;
    case spv::Op::OpFunctionCall:
      // We cannot be sure of the actual connection between the type
      // of the parameter and the type of the result, so we should not
      // do anything.  If the result type needs to be fixed, the function call
      // should be inlined.
      return false;
    case spv::Op::OpLoad: {
      Instruction* type_inst = get_def_use_mgr()->GetDef(type_id);
      new_type_id = type_inst->GetSingleWordInOperand(1);
      break;
    }
    case spv::Op::OpStore: {
      uint32_t obj_id = inst->GetSingleWordInOperand(1);
      Instruction* obj_inst = get_def_use_mgr()->GetDef(obj_id);
      uint32_t obj_type_id = obj_inst->type_id();

      uint32_t ptr_id = inst->GetSingleWordInOperand(0);
      Instruction* ptr_inst = get_def_use_mgr()->GetDef(ptr_id);
      uint32_t pointee_type_id = GetPointeeTypeId(ptr_inst);

      if (obj_type_id != pointee_type_id) {
        if (context()->get_type_mgr()->GetType(obj_type_id)->AsImage() &&
            context()->get_type_mgr()->GetType(pointee_type_id)->AsImage()) {
          // When storing an image, allow the type mismatch
          // and let the later legalization passes eliminate the OpStore.
          // This is to support assigning an image to a variable,
          // where the assigned image does not have a pre-defined
          // image format.
          return false;
        }

        uint32_t copy_id = GenerateCopy(obj_inst, pointee_type_id, inst);
        if (copy_id == 0) {
          return false;
        }
        inst->SetInOperand(1, {copy_id});
        context()->UpdateDefUse(inst);
      }
    } break;
    case spv::Op::OpCopyMemory:
    case spv::Op::OpCopyMemorySized:
      // TODO: May need to expand the copy as we do with the stores.
      break;
    case spv::Op::OpCompositeConstruct:
    case spv::Op::OpCompositeExtract:
    case spv::Op::OpCompositeInsert:
      // TODO: DXC does not seem to generate code that will require changes to
      // these opcode.  The can be implemented when they come up.
      break;
    case spv::Op::OpImageTexelPointer:
    case spv::Op::OpBitcast:
      // Nothing to change for these opcode.  The result type is the same
      // regardless of the type of the operand.
      return false;
    default:
      // I expect the remaining instructions to act on types that are guaranteed
      // to be unique, so no change will be necessary.
      break;
  }

  // If the operand forces the result type, then make sure the result type
  // matches, and update the uses of |inst|.  We do not have to check the uses
  // of |inst| in the result type is not forced because we are only looking for
  // issue that come from mismatches between function formal and actual
  // parameters after the function has been inlined.  These parameters are
  // pointers. Once the type no longer depends on the type of the parameter,
  // then the types should have be correct.
  if (new_type_id != 0) {
    modified = ChangeResultType(inst, new_type_id);

    std::vector<std::pair<Instruction*, uint32_t>> uses;
    get_def_use_mgr()->ForEachUse(inst,
                                  [&uses](Instruction* use, uint32_t idx) {
                                    uses.push_back({use, idx});
                                  });

    for (auto& use : uses) {
      PropagateType(use.first, new_type_id, use.second, seen);
    }

    if (inst->opcode() == spv::Op::OpPhi) {
      seen->erase(inst->result_id());
    }
  }
  return modified;
}